

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void variance_double_4_suite::test_scatter(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  value_type local_80;
  moment_variance<double,_4> filter;
  
  filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
  super_span<double,_4UL>.member.data = (pointer)&filter;
  filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
  super_array<double,_4UL>._M_elems[2] = 0.0;
  filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
  super_array<double,_4UL>._M_elems[3] = 0.0;
  filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
  super_array<double,_4UL>._M_elems[0] = 0.0;
  filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
  super_array<double,_4UL>._M_elems[1] = 0.0;
  filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
  super_span<double,_4UL>.member.size = 0;
  filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
  super_span<double,_4UL>.member.next = 4;
  filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.mean = 0.0;
  filter.sum.variance = 0.0;
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)2>::push
            ((basic_moment<double,_4UL,_(trial::online::with)2> *)
             filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
             super_span<double,_4UL>.member.data,1.0);
  local_80 = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.mean;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x2ad,"void variance_double_4_suite::test_scatter()",&local_80,
             &stack0xffffffffffffff78);
  local_80 = 0.0;
  if ((filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
       super_span<double,_4UL>.member.size != 0) &&
     (auVar5._8_4_ = (int)(filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.
                           window.super_span<double,_4UL>.member.size >> 0x20),
     auVar5._0_8_ = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
                    super_span<double,_4UL>.member.size, auVar5._12_4_ = 0x45300000,
     local_80 = filter.sum.variance /
                ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,
                                  (int)filter.
                                       super_basic_moment<double,_4UL,_(trial::online::with)1>.
                                       member.window.super_span<double,_4UL>.member.size) -
                4503599627370496.0)), local_80 <= 0.0)) {
    local_80 = 0.0;
  }
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x2ae,"void variance_double_4_suite::test_scatter()",&local_80,
             &stack0xffffffffffffff78);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)2>::push(&filter,3.0);
  local_80 = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.mean;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x2b1,"void variance_double_4_suite::test_scatter()",&local_80,
             &stack0xffffffffffffff78);
  local_80 = 0.0;
  if (filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
      super_span<double,_4UL>.member.size != 0) {
    auVar1._8_4_ = (int)(filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.
                         window.super_span<double,_4UL>.member.size >> 0x20);
    auVar1._0_8_ = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
                   super_span<double,_4UL>.member.size;
    auVar1._12_4_ = 0x45300000;
    local_80 = filter.sum.variance /
               ((auVar1._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,
                                 (int)filter.super_basic_moment<double,_4UL,_(trial::online::with)1>
                                      .member.window.super_span<double,_4UL>.member.size) -
               4503599627370496.0));
    if (local_80 <= 0.0) {
      local_80 = 0.0;
    }
  }
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x2b2,"void variance_double_4_suite::test_scatter()",&local_80,
             &stack0xffffffffffffff78);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)2>::push(&filter,0.0);
  local_80 = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.mean;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.33333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2b5,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x3ff55551d68c692f,predicate);
  local_80 = 0.0;
  if ((filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
       super_span<double,_4UL>.member.size != 0) &&
     (auVar6._8_4_ = (int)(filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.
                           window.super_span<double,_4UL>.member.size >> 0x20),
     auVar6._0_8_ = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
                    super_span<double,_4UL>.member.size, auVar6._12_4_ = 0x45300000,
     local_80 = filter.sum.variance /
                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,
                                  (int)filter.
                                       super_basic_moment<double,_4UL,_(trial::online::with)1>.
                                       member.window.super_span<double,_4UL>.member.size) -
                4503599627370496.0)), local_80 <= 0.0)) {
    local_80 = 0.0;
  }
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.55556","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2b6,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x3ff8e392e1ef73c1,predicate_00);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)2>::push(&filter,5.0);
  local_80 = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.mean;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2b9,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x4002000000000000,predicate_01);
  local_80 = 0.0;
  if (filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
      super_span<double,_4UL>.member.size != 0) {
    auVar2._8_4_ = (int)(filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.
                         window.super_span<double,_4UL>.member.size >> 0x20);
    auVar2._0_8_ = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
                   super_span<double,_4UL>.member.size;
    auVar2._12_4_ = 0x45300000;
    local_80 = filter.sum.variance /
               ((auVar2._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,
                                 (int)filter.super_basic_moment<double,_4UL,_(trial::online::with)1>
                                      .member.window.super_span<double,_4UL>.member.size) -
               4503599627370496.0));
    if (local_80 <= 0.0) {
      local_80 = 0.0;
    }
  }
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","3.6875","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2ba,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x400d800000000000,predicate_02);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)2>::push(&filter,2.0);
  local_80 = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.mean;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2bd,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x4004000000000000,predicate_03);
  local_80 = 0.0;
  if ((filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
       super_span<double,_4UL>.member.size != 0) &&
     (auVar7._8_4_ = (int)(filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.
                           window.super_span<double,_4UL>.member.size >> 0x20),
     auVar7._0_8_ = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
                    super_span<double,_4UL>.member.size, auVar7._12_4_ = 0x45300000,
     local_80 = filter.sum.variance /
                ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,
                                  (int)filter.
                                       super_basic_moment<double,_4UL,_(trial::online::with)1>.
                                       member.window.super_span<double,_4UL>.member.size) -
                4503599627370496.0)), local_80 <= 0.0)) {
    local_80 = 0.0;
  }
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","3.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2be,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x400a000000000000,predicate_04);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)2>::push(&filter,3.0);
  local_80 = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.mean;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2c1,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x4004000000000000,predicate_05);
  local_80 = 0.0;
  if (filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
      super_span<double,_4UL>.member.size != 0) {
    auVar3._8_4_ = (int)(filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.
                         window.super_span<double,_4UL>.member.size >> 0x20);
    auVar3._0_8_ = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
                   super_span<double,_4UL>.member.size;
    auVar3._12_4_ = 0x45300000;
    local_80 = filter.sum.variance /
               ((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,
                                 (int)filter.super_basic_moment<double,_4UL,_(trial::online::with)1>
                                      .member.window.super_span<double,_4UL>.member.size) -
               4503599627370496.0));
    if (local_80 <= 0.0) {
      local_80 = 0.0;
    }
  }
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","3.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2c2,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x400a000000000000,predicate_06);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)2>::push(&filter,4.0);
  local_80 = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.mean;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2c5,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x400c000000000000,predicate_07);
  local_80 = 0.0;
  if ((filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
       super_span<double,_4UL>.member.size != 0) &&
     (auVar8._8_4_ = (int)(filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.
                           window.super_span<double,_4UL>.member.size >> 0x20),
     auVar8._0_8_ = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
                    super_span<double,_4UL>.member.size, auVar8._12_4_ = 0x45300000,
     local_80 = filter.sum.variance /
                ((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,
                                  (int)filter.
                                       super_basic_moment<double,_4UL,_(trial::online::with)1>.
                                       member.window.super_span<double,_4UL>.member.size) -
                4503599627370496.0)), local_80 <= 0.0)) {
    local_80 = 0.0;
  }
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2c6,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x3ff4000000000000,predicate_08);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)2>::push(&filter,1.0);
  local_80 = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.mean;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2c9,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x4004000000000000,predicate_09);
  local_80 = 0.0;
  if (filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
      super_span<double,_4UL>.member.size != 0) {
    auVar4._8_4_ = (int)(filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.
                         window.super_span<double,_4UL>.member.size >> 0x20);
    auVar4._0_8_ = filter.super_basic_moment<double,_4UL,_(trial::online::with)1>.member.window.
                   super_span<double,_4UL>.member.size;
    auVar4._12_4_ = 0x45300000;
    local_80 = filter.sum.variance /
               ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,
                                 (int)filter.super_basic_moment<double,_4UL,_(trial::online::with)1>
                                      .member.window.super_span<double,_4UL>.member.size) -
               4503599627370496.0));
    if (local_80 <= 0.0) {
      local_80 = 0.0;
    }
  }
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,(char *)0x2ca,0x10c822,(char *)&local_80,(double *)&stack0xffffffffffffff78,
             (double *)0x3ff4000000000000,predicate_10);
  return;
}

Assistant:

void test_same()
{
    window::moment<double, 2> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
}